

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser.cpp
# Opt level: O0

void __thiscall
CLaser::CLaser(CLaser *this,CGameWorld *pGameWorld,vec2 Pos,vec2 Direction,float StartEnergy,
              int Owner)

{
  long lVar1;
  CGameWorld *this_00;
  undefined4 in_EDX;
  CEntity *in_RDI;
  long in_FS_OFFSET;
  CGameWorld *in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  CGameWorld *in_stack_ffffffffffffffa8;
  vec2 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CEntity::CEntity(in_RDI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                   in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa0);
  in_RDI->_vptr_CEntity = (_func_int **)&PTR__CLaser_00184988;
  vector2_base<float>::vector2_base((vector2_base<float> *)(in_RDI + 1));
  vector2_base<float>::vector2_base((vector2_base<float> *)&in_RDI[1].m_pGameWorld);
  *(undefined4 *)((long)&in_RDI[1].m_pNextTypeEntity + 4) = in_EDX;
  *(undefined4 *)&in_RDI[1].m_pPrevTypeEntity = in_XMM2_Da;
  in_RDI[1].m_pGameWorld = in_XMM1_Qa;
  *(undefined4 *)((long)&in_RDI[1].m_pPrevTypeEntity + 4) = 0;
  *(undefined4 *)&in_RDI[1].m_pNextTypeEntity = 0;
  this_00 = CEntity::GameWorld(in_RDI);
  CGameWorld::InsertEntity(this_00,in_RDI);
  DoBounce((CLaser *)in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CLaser::CLaser(CGameWorld *pGameWorld, vec2 Pos, vec2 Direction, float StartEnergy, int Owner)
: CEntity(pGameWorld, CGameWorld::ENTTYPE_LASER, Pos)
{
	m_Owner = Owner;
	m_Energy = StartEnergy;
	m_Dir = Direction;
	m_Bounces = 0;
	m_EvalTick = 0;
	GameWorld()->InsertEntity(this);
	DoBounce();
}